

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O2

int countint(TValue *key,int *nums)

{
  int iVar1;
  uint x;
  
  iVar1 = arrayindex(key);
  x = iVar1 - 1;
  if (x < 0x4000000) {
    iVar1 = luaO_log2(x);
    nums[(long)iVar1 + 1] = nums[(long)iVar1 + 1] + 1;
  }
  return (uint)(x < 0x4000000);
}

Assistant:

static int countint (const TValue *key, int *nums) {
  int k = arrayindex(key);
  if (0 < k && k <= MAXASIZE) {  /* is `key' an appropriate array index? */
    nums[ceillog2(k)]++;  /* count as such */
    return 1;
  }
  else
    return 0;
}